

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O0

void __thiscall miniros::network::NetAddress::reset(NetAddress *this)

{
  undefined4 *in_RDI;
  
  if (*(long *)(in_RDI + 0xc) != 0) {
    free(*(void **)(in_RDI + 0xc));
    *(undefined8 *)(in_RDI + 0xc) = 0;
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 2),"");
  in_RDI[10] = 0;
  *in_RDI = 0;
  return;
}

Assistant:

void NetAddress::reset()
{
  if (rawAddress) {
    free(rawAddress);
    rawAddress = nullptr;
  }
  address = "";
  port = 0;
  type = Type::AddressInvalid;
}